

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

void __thiscall xercesc_4_0::ICUTranscoder::~ICUTranscoder(ICUTranscoder *this)

{
  MemoryManager *pMVar1;
  
  (this->super_XMLTranscoder)._vptr_XMLTranscoder = (_func_int **)&PTR__ICUTranscoder_004089e8;
  pMVar1 = (this->super_XMLTranscoder).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fSrcOffsets);
  if (this->fConverter != (UConverter *)0x0) {
    ucnv_close_70();
    this->fConverter = (UConverter *)0x0;
  }
  XMLTranscoder::~XMLTranscoder(&this->super_XMLTranscoder);
  return;
}

Assistant:

ICUTranscoder::~ICUTranscoder()
{
    getMemoryManager()->deallocate(fSrcOffsets);//delete [] fSrcOffsets;

    // If there is a converter, ask ICU to clean it up
    if (fConverter)
    {
        // <TBD> Does this actually delete the structure???
        ucnv_close(fConverter);
        fConverter = 0;
    }
}